

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O1

void test_bson_iso8601_leap_year(void)

{
  test_date_io("1972-02-29T00:00:00Z","1972-02-29T00:00:00Z",0xfdf398c00);
  test_date_io("1976-02-29T00:00:00Z","1976-02-29T00:00:00Z",0x2d43249800);
  test_date_io("1980-02-29T00:00:00Z","1980-02-29T00:00:00Z",0x4aa70fa400);
  test_date_io("1984-02-29T00:00:00Z","1984-02-29T00:00:00Z",0x680afab000);
  test_date_io("1988-02-29T00:00:00Z","1988-02-29T00:00:00Z",0x856ee5bc00);
  test_date_io("1992-02-29T00:00:00Z","1992-02-29T00:00:00Z",0xa2d2d0c800);
  test_date_io("1996-02-29T00:00:00Z","1996-02-29T00:00:00Z",0xc036bbd400);
  test_date_io("2000-02-29T00:00:00Z","2000-02-29T00:00:00Z",0xdd9aa6e000);
  test_date_io("2004-02-29T00:00:00Z","2004-02-29T00:00:00Z",0xfafe91ec00);
  test_date_io("2008-02-29T00:00:00Z","2008-02-29T00:00:00Z",0x118627cf800);
  test_date_io("2012-02-29T00:00:00Z","2012-02-29T00:00:00Z",0x135c6680400);
  test_date_io("2016-02-29T00:00:00Z","2016-02-29T00:00:00Z",0x1532a531000);
  test_date_io("2020-02-29T00:00:00Z","2020-02-29T00:00:00Z",0x1708e3e1c00);
  test_date_io("2024-02-29T00:00:00Z","2024-02-29T00:00:00Z",0x18df2292800);
  test_date_io("2028-02-29T00:00:00Z","2028-02-29T00:00:00Z",0x1ab56143400);
  test_date_io("2032-02-29T00:00:00Z","2032-02-29T00:00:00Z",0x1c8b9ff4000);
  test_date_io("2036-02-29T00:00:00Z","2036-02-29T00:00:00Z",0x1e61dea4c00);
  test_date_io("2040-02-29T00:00:00Z","2040-02-29T00:00:00Z",0x20381d55800);
  test_date_io("2044-02-29T00:00:00Z","2044-02-29T00:00:00Z",0x220e5c06400);
  test_date_io("2048-02-29T00:00:00Z","2048-02-29T00:00:00Z",0x23e49ab7000);
  test_date_io("2052-02-29T00:00:00Z","2052-02-29T00:00:00Z",0x25bad967c00);
  test_date_io("2056-02-29T00:00:00Z","2056-02-29T00:00:00Z",0x27911818800);
  test_date_io("2060-02-29T00:00:00Z","2060-02-29T00:00:00Z",0x296756c9400);
  test_date_io("2064-02-29T00:00:00Z","2064-02-29T00:00:00Z",0x2b3d957a000);
  test_date_io("2068-02-29T00:00:00Z","2068-02-29T00:00:00Z",0x2d13d42ac00);
  test_date_io("2072-02-29T00:00:00Z","2072-02-29T00:00:00Z",0x2eea12db800);
  test_date_io("2076-02-29T00:00:00Z","2076-02-29T00:00:00Z",0x30c0518c400);
  test_date_io("2080-02-29T00:00:00Z","2080-02-29T00:00:00Z",0x3296903d000);
  test_date_io("2084-02-29T00:00:00Z","2084-02-29T00:00:00Z",0x346cceedc00);
  test_date_io("2088-02-29T00:00:00Z","2088-02-29T00:00:00Z",0x36430d9e800);
  test_date_io("2092-02-29T00:00:00Z","2092-02-29T00:00:00Z",0x38194c4f400);
  test_date_io("2096-02-29T00:00:00Z","2096-02-29T00:00:00Z",0x39ef8b00000);
  test_date_io("2104-02-29T00:00:00Z","2104-02-29T00:00:00Z",0x3d9bb5fbc00);
  test_date_io("2108-02-29T00:00:00Z","2108-02-29T00:00:00Z",0x3f71f4ac800);
  test_date_io("2112-02-29T00:00:00Z","2112-02-29T00:00:00Z",0x4148335d400);
  test_date_io("2116-02-29T00:00:00Z","2116-02-29T00:00:00Z",0x431e720e000);
  test_date_io("2120-02-29T00:00:00Z","2120-02-29T00:00:00Z",0x44f4b0bec00);
  test_date_io("2124-02-29T00:00:00Z","2124-02-29T00:00:00Z",0x46caef6f800);
  test_date_io("2128-02-29T00:00:00Z","2128-02-29T00:00:00Z",0x48a12e20400);
  test_date_io("2132-02-29T00:00:00Z","2132-02-29T00:00:00Z",0x4a776cd1000);
  test_date_io("2136-02-29T00:00:00Z","2136-02-29T00:00:00Z",0x4c4dab81c00);
  test_date_io("2140-02-29T00:00:00Z","2140-02-29T00:00:00Z",0x4e23ea32800);
  test_date_io("2144-02-29T00:00:00Z","2144-02-29T00:00:00Z",0x4ffa28e3400);
  test_date_io("2148-02-29T00:00:00Z","2148-02-29T00:00:00Z",0x51d06794000);
  test_date_io("2152-02-29T00:00:00Z","2152-02-29T00:00:00Z",0x53a6a644c00);
  test_date_io("2156-02-29T00:00:00Z","2156-02-29T00:00:00Z",0x557ce4f5800);
  test_date_io("2160-02-29T00:00:00Z","2160-02-29T00:00:00Z",0x575323a6400);
  test_date_io("2164-02-29T00:00:00Z","2164-02-29T00:00:00Z",0x59296257000);
  test_date_io("2168-02-29T00:00:00Z","2168-02-29T00:00:00Z",0x5affa107c00);
  test_date_io("2172-02-29T00:00:00Z","2172-02-29T00:00:00Z",0x5cd5dfb8800);
  test_date_io("2176-02-29T00:00:00Z","2176-02-29T00:00:00Z",0x5eac1e69400);
  test_date_io("2180-02-29T00:00:00Z","2180-02-29T00:00:00Z",0x60825d1a000);
  test_date_io("2184-02-29T00:00:00Z","2184-02-29T00:00:00Z",0x62589bcac00);
  test_date_io("2188-02-29T00:00:00Z","2188-02-29T00:00:00Z",0x642eda7b800);
  test_date_io("2192-02-29T00:00:00Z","2192-02-29T00:00:00Z",0x6605192c400);
  test_date_io("2196-02-29T00:00:00Z","2196-02-29T00:00:00Z",0x67db57dd000);
  test_date_io("2204-02-29T00:00:00Z","2204-02-29T00:00:00Z",0x6b8782d8c00);
  test_date_io("2208-02-29T00:00:00Z","2208-02-29T00:00:00Z",0x6d5dc189800);
  test_date_io("2212-02-29T00:00:00Z","2212-02-29T00:00:00Z",0x6f34003a400);
  test_date_io("2216-02-29T00:00:00Z","2216-02-29T00:00:00Z",0x710a3eeb000);
  test_date_io("2220-02-29T00:00:00Z","2220-02-29T00:00:00Z",0x72e07d9bc00);
  test_date_io("2224-02-29T00:00:00Z","2224-02-29T00:00:00Z",0x74b6bc4c800);
  test_date_io("2228-02-29T00:00:00Z","2228-02-29T00:00:00Z",0x768cfafd400);
  test_date_io("2232-02-29T00:00:00Z","2232-02-29T00:00:00Z",0x786339ae000);
  test_date_io("2236-02-29T00:00:00Z","2236-02-29T00:00:00Z",0x7a39785ec00);
  test_date_io("2240-02-29T00:00:00Z","2240-02-29T00:00:00Z",0x7c0fb70f800);
  test_date_io("2244-02-29T00:00:00Z","2244-02-29T00:00:00Z",0x7de5f5c0400);
  test_date_io("2248-02-29T00:00:00Z","2248-02-29T00:00:00Z",0x7fbc3471000);
  test_date_io("2252-02-29T00:00:00Z","2252-02-29T00:00:00Z",0x81927321c00);
  test_date_io("2256-02-29T00:00:00Z","2256-02-29T00:00:00Z",0x8368b1d2800);
  test_date_io("2260-02-29T00:00:00Z","2260-02-29T00:00:00Z",0x853ef083400);
  test_date_io("2264-02-29T00:00:00Z","2264-02-29T00:00:00Z",0x87152f34000);
  test_date_io("2268-02-29T00:00:00Z","2268-02-29T00:00:00Z",0x88eb6de4c00);
  test_date_io("2272-02-29T00:00:00Z","2272-02-29T00:00:00Z",0x8ac1ac95800);
  test_date_io("2276-02-29T00:00:00Z","2276-02-29T00:00:00Z",0x8c97eb46400);
  test_date_io("2280-02-29T00:00:00Z","2280-02-29T00:00:00Z",0x8e6e29f7000);
  test_date_io("2284-02-29T00:00:00Z","2284-02-29T00:00:00Z",0x904468a7c00);
  test_date_io("2288-02-29T00:00:00Z","2288-02-29T00:00:00Z",0x921aa758800);
  test_date_io("2292-02-29T00:00:00Z","2292-02-29T00:00:00Z",0x93f0e609400);
  test_date_io("2296-02-29T00:00:00Z","2296-02-29T00:00:00Z",0x95c724ba000);
  test_date_io("2304-02-29T00:00:00Z","2304-02-29T00:00:00Z",0x99734fb5c00);
  test_date_io("2308-02-29T00:00:00Z","2308-02-29T00:00:00Z",0x9b498e66800);
  test_date_io("2312-02-29T00:00:00Z","2312-02-29T00:00:00Z",0x9d1fcd17400);
  test_date_io("2316-02-29T00:00:00Z","2316-02-29T00:00:00Z",0x9ef60bc8000);
  test_date_io("2320-02-29T00:00:00Z","2320-02-29T00:00:00Z",0xa0cc4a78c00);
  test_date_io("2324-02-29T00:00:00Z","2324-02-29T00:00:00Z",0xa2a28929800);
  test_date_io("2328-02-29T00:00:00Z","2328-02-29T00:00:00Z",0xa478c7da400);
  test_date_io("2332-02-29T00:00:00Z","2332-02-29T00:00:00Z",0xa64f068b000);
  test_date_io("2336-02-29T00:00:00Z","2336-02-29T00:00:00Z",0xa825453bc00);
  test_date_io("2340-02-29T00:00:00Z","2340-02-29T00:00:00Z",0xa9fb83ec800);
  test_date_io("2344-02-29T00:00:00Z","2344-02-29T00:00:00Z",0xabd1c29d400);
  test_date_io("2348-02-29T00:00:00Z","2348-02-29T00:00:00Z",0xada8014e000);
  test_date_io("2352-02-29T00:00:00Z","2352-02-29T00:00:00Z",0xaf7e3ffec00);
  test_date_io("2356-02-29T00:00:00Z","2356-02-29T00:00:00Z",0xb1547eaf800);
  test_date_io("2360-02-29T00:00:00Z","2360-02-29T00:00:00Z",0xb32abd60400);
  test_date_io("2364-02-29T00:00:00Z","2364-02-29T00:00:00Z",0xb500fc11000);
  test_date_io("2368-02-29T00:00:00Z","2368-02-29T00:00:00Z",0xb6d73ac1c00);
  test_date_io("2372-02-29T00:00:00Z","2372-02-29T00:00:00Z",0xb8ad7972800);
  test_date_io("2376-02-29T00:00:00Z","2376-02-29T00:00:00Z",0xba83b823400);
  test_date_io("2380-02-29T00:00:00Z","2380-02-29T00:00:00Z",0xbc59f6d4000);
  test_date_io("2384-02-29T00:00:00Z","2384-02-29T00:00:00Z",0xbe303584c00);
  test_date_io("2388-02-29T00:00:00Z","2388-02-29T00:00:00Z",0xc0067435800);
  test_date_io("2392-02-29T00:00:00Z","2392-02-29T00:00:00Z",0xc1dcb2e6400);
  test_date_io("2396-02-29T00:00:00Z","2396-02-29T00:00:00Z",0xc3b2f197000);
  test_date_io("2400-02-29T00:00:00Z","2400-02-29T00:00:00Z",0xc5893047c00);
  return;
}

Assistant:

static void
test_bson_iso8601_leap_year (void)
{
   test_date_rt ("1972-02-29T00:00:00Z", 68169600000ULL);
   test_date_rt ("1976-02-29T00:00:00Z", 194400000000ULL);
   test_date_rt ("1980-02-29T00:00:00Z", 320630400000ULL);
   test_date_rt ("1984-02-29T00:00:00Z", 446860800000ULL);
   test_date_rt ("1988-02-29T00:00:00Z", 573091200000ULL);
   test_date_rt ("1992-02-29T00:00:00Z", 699321600000ULL);
   test_date_rt ("1996-02-29T00:00:00Z", 825552000000ULL);
   test_date_rt ("2000-02-29T00:00:00Z", 951782400000ULL);
   test_date_rt ("2004-02-29T00:00:00Z", 1078012800000ULL);
   test_date_rt ("2008-02-29T00:00:00Z", 1204243200000ULL);
   test_date_rt ("2012-02-29T00:00:00Z", 1330473600000ULL);
   test_date_rt ("2016-02-29T00:00:00Z", 1456704000000ULL);
   test_date_rt ("2020-02-29T00:00:00Z", 1582934400000ULL);
   test_date_rt ("2024-02-29T00:00:00Z", 1709164800000ULL);
   test_date_rt ("2028-02-29T00:00:00Z", 1835395200000ULL);
   test_date_rt ("2032-02-29T00:00:00Z", 1961625600000ULL);
   test_date_rt ("2036-02-29T00:00:00Z", 2087856000000ULL);

   if (!IS_TIME_T_SMALL) {
      test_date_rt ("2040-02-29T00:00:00Z", 2214086400000ULL);
      test_date_rt ("2044-02-29T00:00:00Z", 2340316800000ULL);
      test_date_rt ("2048-02-29T00:00:00Z", 2466547200000ULL);
      test_date_rt ("2052-02-29T00:00:00Z", 2592777600000ULL);
      test_date_rt ("2056-02-29T00:00:00Z", 2719008000000ULL);
      test_date_rt ("2060-02-29T00:00:00Z", 2845238400000ULL);
      test_date_rt ("2064-02-29T00:00:00Z", 2971468800000ULL);
      test_date_rt ("2068-02-29T00:00:00Z", 3097699200000ULL);
      test_date_rt ("2072-02-29T00:00:00Z", 3223929600000ULL);
      test_date_rt ("2076-02-29T00:00:00Z", 3350160000000ULL);
      test_date_rt ("2080-02-29T00:00:00Z", 3476390400000ULL);
      test_date_rt ("2084-02-29T00:00:00Z", 3602620800000ULL);
      test_date_rt ("2088-02-29T00:00:00Z", 3728851200000ULL);
      test_date_rt ("2092-02-29T00:00:00Z", 3855081600000ULL);
      test_date_rt ("2096-02-29T00:00:00Z", 3981312000000ULL);
      test_date_rt ("2104-02-29T00:00:00Z", 4233686400000ULL);
      test_date_rt ("2108-02-29T00:00:00Z", 4359916800000ULL);
      test_date_rt ("2112-02-29T00:00:00Z", 4486147200000ULL);
      test_date_rt ("2116-02-29T00:00:00Z", 4612377600000ULL);
      test_date_rt ("2120-02-29T00:00:00Z", 4738608000000ULL);
      test_date_rt ("2124-02-29T00:00:00Z", 4864838400000ULL);
      test_date_rt ("2128-02-29T00:00:00Z", 4991068800000ULL);
      test_date_rt ("2132-02-29T00:00:00Z", 5117299200000ULL);
      test_date_rt ("2136-02-29T00:00:00Z", 5243529600000ULL);
      test_date_rt ("2140-02-29T00:00:00Z", 5369760000000ULL);
      test_date_rt ("2144-02-29T00:00:00Z", 5495990400000ULL);
      test_date_rt ("2148-02-29T00:00:00Z", 5622220800000ULL);
      test_date_rt ("2152-02-29T00:00:00Z", 5748451200000ULL);
      test_date_rt ("2156-02-29T00:00:00Z", 5874681600000ULL);
      test_date_rt ("2160-02-29T00:00:00Z", 6000912000000ULL);
      test_date_rt ("2164-02-29T00:00:00Z", 6127142400000ULL);
      test_date_rt ("2168-02-29T00:00:00Z", 6253372800000ULL);
      test_date_rt ("2172-02-29T00:00:00Z", 6379603200000ULL);
      test_date_rt ("2176-02-29T00:00:00Z", 6505833600000ULL);
      test_date_rt ("2180-02-29T00:00:00Z", 6632064000000ULL);
      test_date_rt ("2184-02-29T00:00:00Z", 6758294400000ULL);
      test_date_rt ("2188-02-29T00:00:00Z", 6884524800000ULL);
      test_date_rt ("2192-02-29T00:00:00Z", 7010755200000ULL);
      test_date_rt ("2196-02-29T00:00:00Z", 7136985600000ULL);
      test_date_rt ("2204-02-29T00:00:00Z", 7389360000000ULL);
      test_date_rt ("2208-02-29T00:00:00Z", 7515590400000ULL);
      test_date_rt ("2212-02-29T00:00:00Z", 7641820800000ULL);
      test_date_rt ("2216-02-29T00:00:00Z", 7768051200000ULL);
      test_date_rt ("2220-02-29T00:00:00Z", 7894281600000ULL);
      test_date_rt ("2224-02-29T00:00:00Z", 8020512000000ULL);
      test_date_rt ("2228-02-29T00:00:00Z", 8146742400000ULL);
      test_date_rt ("2232-02-29T00:00:00Z", 8272972800000ULL);
      test_date_rt ("2236-02-29T00:00:00Z", 8399203200000ULL);
      test_date_rt ("2240-02-29T00:00:00Z", 8525433600000ULL);
      test_date_rt ("2244-02-29T00:00:00Z", 8651664000000ULL);
      test_date_rt ("2248-02-29T00:00:00Z", 8777894400000ULL);
      test_date_rt ("2252-02-29T00:00:00Z", 8904124800000ULL);
      test_date_rt ("2256-02-29T00:00:00Z", 9030355200000ULL);
      test_date_rt ("2260-02-29T00:00:00Z", 9156585600000ULL);
      test_date_rt ("2264-02-29T00:00:00Z", 9282816000000ULL);
      test_date_rt ("2268-02-29T00:00:00Z", 9409046400000ULL);
      test_date_rt ("2272-02-29T00:00:00Z", 9535276800000ULL);
      test_date_rt ("2276-02-29T00:00:00Z", 9661507200000ULL);
      test_date_rt ("2280-02-29T00:00:00Z", 9787737600000ULL);
      test_date_rt ("2284-02-29T00:00:00Z", 9913968000000ULL);
      test_date_rt ("2288-02-29T00:00:00Z", 10040198400000ULL);
      test_date_rt ("2292-02-29T00:00:00Z", 10166428800000ULL);
      test_date_rt ("2296-02-29T00:00:00Z", 10292659200000ULL);
      test_date_rt ("2304-02-29T00:00:00Z", 10545033600000ULL);
      test_date_rt ("2308-02-29T00:00:00Z", 10671264000000ULL);
      test_date_rt ("2312-02-29T00:00:00Z", 10797494400000ULL);
      test_date_rt ("2316-02-29T00:00:00Z", 10923724800000ULL);
      test_date_rt ("2320-02-29T00:00:00Z", 11049955200000ULL);
      test_date_rt ("2324-02-29T00:00:00Z", 11176185600000ULL);
      test_date_rt ("2328-02-29T00:00:00Z", 11302416000000ULL);
      test_date_rt ("2332-02-29T00:00:00Z", 11428646400000ULL);
      test_date_rt ("2336-02-29T00:00:00Z", 11554876800000ULL);
      test_date_rt ("2340-02-29T00:00:00Z", 11681107200000ULL);
      test_date_rt ("2344-02-29T00:00:00Z", 11807337600000ULL);
      test_date_rt ("2348-02-29T00:00:00Z", 11933568000000ULL);
      test_date_rt ("2352-02-29T00:00:00Z", 12059798400000ULL);
      test_date_rt ("2356-02-29T00:00:00Z", 12186028800000ULL);
      test_date_rt ("2360-02-29T00:00:00Z", 12312259200000ULL);
      test_date_rt ("2364-02-29T00:00:00Z", 12438489600000ULL);
      test_date_rt ("2368-02-29T00:00:00Z", 12564720000000ULL);
      test_date_rt ("2372-02-29T00:00:00Z", 12690950400000ULL);
      test_date_rt ("2376-02-29T00:00:00Z", 12817180800000ULL);
      test_date_rt ("2380-02-29T00:00:00Z", 12943411200000ULL);
      test_date_rt ("2384-02-29T00:00:00Z", 13069641600000ULL);
      test_date_rt ("2388-02-29T00:00:00Z", 13195872000000ULL);
      test_date_rt ("2392-02-29T00:00:00Z", 13322102400000ULL);
      test_date_rt ("2396-02-29T00:00:00Z", 13448332800000ULL);
      test_date_rt ("2400-02-29T00:00:00Z", 13574563200000ULL);
   }
}